

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall CharacterInstance::CharacterInstance(CharacterInstance *this,string *value)

{
  bool bVar1;
  undefined8 *puVar2;
  string *psVar3;
  ulong in_RSI;
  string *in_RDI;
  string *in_stack_ffffffffffffff98;
  Instance *this_00;
  undefined1 local_31 [33];
  ulong local_10;
  
  this_00 = (Instance *)local_31;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"Character",(allocator *)this_00);
  Instance::Instance(this_00,in_RDI);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  *(undefined ***)in_RDI = &PTR__CharacterInstance_0020ed60;
  bVar1 = Grammar::is_character_value(in_stack_ffffffffffffff98);
  if (!bVar1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  psVar3 = (string *)std::__cxx11::string::operator[](local_10);
  in_RDI[0x58] = *psVar3;
  return;
}

Assistant:

CharacterInstance::CharacterInstance(const std::string& value) : Instance("Character") {
    if (!Grammar::is_character_value(value))
        throw EXC_INVALID_ARGUMENT;
    _value = value[1];
}